

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O3

size_t HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  U32 *pUVar1;
  int *piVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  size_t sVar10;
  
  uVar5 = *maxSymbolValuePtr;
  memset(workSpace,0,0x1000);
  if (sourceSize == 0) {
    sVar10 = 0;
    memset(count,0,(ulong)(uVar5 + 1));
    *maxSymbolValuePtr = 0;
  }
  else {
    pbVar4 = (byte *)((long)source + sourceSize);
    if (uVar5 == 0) {
      uVar5 = 0xff;
    }
    if (0x13 < (long)sourceSize) {
      uVar3 = *source;
      pbVar8 = (byte *)source;
      do {
        uVar6 = *(uint *)(pbVar8 + 4);
        workSpace[uVar3 & 0xff] = workSpace[uVar3 & 0xff] + 1;
        workSpace[(ulong)(uVar3 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar3 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar3 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar3 >> 0x18) + 0x300] = workSpace[(ulong)(uVar3 >> 0x18) + 0x300] + 1;
        uVar3 = *(uint *)(pbVar8 + 8);
        workSpace[uVar6 & 0xff] = workSpace[uVar6 & 0xff] + 1;
        workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar6 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar6 >> 0x18) + 0x300] = workSpace[(ulong)(uVar6 >> 0x18) + 0x300] + 1;
        uVar6 = *(uint *)(pbVar8 + 0xc);
        workSpace[uVar3 & 0xff] = workSpace[uVar3 & 0xff] + 1;
        workSpace[(ulong)(uVar3 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar3 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar3 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar3 >> 0x18) + 0x300] = workSpace[(ulong)(uVar3 >> 0x18) + 0x300] + 1;
        uVar3 = *(uint *)(pbVar8 + 0x10);
        workSpace[uVar6 & 0xff] = workSpace[uVar6 & 0xff] + 1;
        workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] =
             workSpace[(ulong)(uVar6 >> 8 & 0xff) + 0x100] + 1;
        piVar2 = (int *)((long)workSpace + (ulong)(uVar6 >> 0xe & 0x3fc) + 0x800);
        *piVar2 = *piVar2 + 1;
        workSpace[(ulong)(uVar6 >> 0x18) + 0x300] = workSpace[(ulong)(uVar6 >> 0x18) + 0x300] + 1;
        source = pbVar8 + 0x10;
        pbVar9 = pbVar8 + 0x14;
        pbVar8 = (byte *)source;
      } while (pbVar9 < pbVar4 + -0xf);
    }
    for (; source < pbVar4; source = (void *)((long)source + 1)) {
      workSpace[*source] = workSpace[*source] + 1;
    }
    if (uVar5 < 0xff && check != trustInput) {
      uVar3 = 0xff;
      do {
        pUVar1 = workSpace + uVar3;
        *pUVar1 = *pUVar1 + workSpace[(ulong)uVar3 + 0x200] + workSpace[(ulong)uVar3 + 0x100] +
                            workSpace[(ulong)uVar3 + 0x300];
        if (*pUVar1 != 0) {
          return 0xffffffffffffffd0;
        }
        uVar3 = uVar3 - 1;
      } while (uVar5 < uVar3);
    }
    uVar3 = 0xff;
    if (uVar5 < 0xff) {
      uVar3 = uVar5;
    }
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar6 = workSpace[uVar7 + 0x100] + workSpace[uVar7] + workSpace[uVar7 + 0x200] +
              workSpace[uVar7 + 0x300];
      count[uVar7] = uVar6;
      if (uVar6 <= uVar5) {
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
      uVar7 = uVar7 + 1;
    } while (uVar3 + 1 != uVar7);
    do {
      uVar6 = uVar3;
      uVar3 = uVar6 - 1;
    } while (count[uVar6] == 0);
    *maxSymbolValuePtr = uVar6;
    sVar10 = (size_t)uVar5;
  }
  return sVar10;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* safety checks */
    if (!sourceSize) {
        memset(count, 0, maxSymbolValue + 1);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    if (!maxSymbolValue) maxSymbolValue = 255;            /* 0 == default */

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    if (check) {   /* verify stats will fit into destination table */
        U32 s; for (s=255; s>maxSymbolValue; s--) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s]) return ERROR(maxSymbolValue_tooSmall);
    }   }

    {   U32 s;
        if (maxSymbolValue > 255) maxSymbolValue = 255;
        for (s=0; s<=maxSymbolValue; s++) {
            count[s] = Counting1[s] + Counting2[s] + Counting3[s] + Counting4[s];
            if (count[s] > max) max = count[s];
    }   }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;
    return (size_t)max;
}